

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O3

ForStatement * __thiscall SQCompilation::SQParser::parseForStatement(SQParser *this)

{
  long lVar1;
  ForStatement *pFVar2;
  uint uVar3;
  Node *pNVar4;
  Expr *pEVar5;
  Expr *pEVar6;
  Statement *pSVar7;
  long lVar8;
  Chunk *pCVar9;
  bool local_39;
  SQInteger local_38;
  
  uVar3 = this->_depth;
  if (500 < uVar3) {
    reportDiagnostic(this,0x1d);
    uVar3 = this->_depth;
  }
  this->_depth = uVar3 + 1;
  lVar1 = (this->_lex)._tokencolumn;
  local_38 = (this->_lex)._tokenline;
  Lex(this);
  Expect(this,0x28);
  if (this->_token == 0x3b) {
    pNVar4 = (Node *)0x0;
  }
  else if (this->_token == 0x11b) {
    pNVar4 = (Node *)parseLocalDeclStatement(this);
  }
  else {
    pNVar4 = &parseCommaExpr(this,SQE_REGULAR)->super_Node;
  }
  Expect(this,0x3b);
  if (this->_token == 0x3b) {
    pEVar5 = (Expr *)0x0;
  }
  else {
    pEVar5 = Expression(this,SQE_LOOP_CONDITION);
  }
  Expect(this,0x3b);
  if (this->_token == 0x29) {
    pEVar6 = (Expr *)0x0;
  }
  else {
    pEVar6 = parseCommaExpr(this,SQE_REGULAR);
  }
  Expect(this,0x29);
  if ((this->_token == 0x7b) && (((this->_lex)._prevflags & 1) != 0)) {
    reportDiagnostic(this,0x69);
  }
  pSVar7 = IfLikeBlock(this,&local_39);
  if ((this->_lex)._prevtoken != 10) {
    lVar8 = this->_token;
    if (lVar8 < 0x7d) {
      if ((lVar8 == 0) || (lVar8 == 0x3b)) goto LAB_001603b9;
    }
    else if ((lVar8 == 0x7d) || (lVar8 == 0x14c)) goto LAB_001603b9;
    reportDiagnostic(this,0x38,"for loop body");
  }
  lVar8 = this->_token;
LAB_001603b9:
  if ((((lVar8 != 0) && (lVar8 != 0x7d)) &&
      ((this->_lex)._tokenline != (long)(pSVar7->super_Node)._coordinates.lineEnd)) &&
     (lVar1 < (this->_lex)._tokencolumn)) {
    reportDiagnostic(this,0x68);
  }
  pCVar9 = Arena::findChunk(this->_astArena,0x40);
  pFVar2 = (ForStatement *)pCVar9->_ptr;
  pCVar9->_ptr = (uint8_t *)(pFVar2 + 1);
  (pFVar2->super_LoopStatement).super_Statement.super_Node._op = TO_FOR;
  (pFVar2->super_LoopStatement).super_Statement.super_Node._coordinates.lineEnd = -1;
  (pFVar2->super_LoopStatement).super_Statement.super_Node._coordinates.columnEnd = -1;
  (pFVar2->super_LoopStatement)._body = pSVar7;
  (pFVar2->super_LoopStatement).super_Statement.super_Node.super_ArenaObj._vptr_ArenaObj =
       (_func_int **)&PTR__ArenaObj_001a28b8;
  pFVar2->_init = pNVar4;
  pFVar2->_cond = pEVar5;
  pFVar2->_mod = pEVar6;
  (pFVar2->super_LoopStatement).super_Statement.super_Node._coordinates.lineStart = (int)local_38;
  (pFVar2->super_LoopStatement).super_Statement.super_Node._coordinates.columnStart = (int)lVar1;
  (pFVar2->super_LoopStatement).super_Statement.super_Node._coordinates.lineEnd =
       (int)(this->_lex)._currentline;
  (pFVar2->super_LoopStatement).super_Statement.super_Node._coordinates.columnEnd =
       (int)(this->_lex)._currentcolumn;
  this->_depth = this->_depth - 1;
  return pFVar2;
}

Assistant:

ForStatement* SQParser::parseForStatement()
{
    NestingChecker nc(this);

    SQInteger l = line(), c = column();

    Consume(TK_FOR);

    Expect(_SC('('));

    Node *init = NULL;
    if (_token == TK_LOCAL)
        init = parseLocalDeclStatement();
    else if (_token != _SC(';')) {
        init = parseCommaExpr(SQE_REGULAR);
    }
    Expect(_SC(';'));

    Expr *cond = NULL;
    if(_token != _SC(';')) {
        cond = Expression(SQE_LOOP_CONDITION);
    }
    Expect(_SC(';'));

    Expr *mod = NULL;
    if(_token != _SC(')')) {
        mod = parseCommaExpr(SQE_REGULAR);
    }
    Expect(_SC(')'));

    bool wrapped = false;
    checkBraceIndentationStyle();
    Statement *body = IfLikeBlock(wrapped);

    if (!IsEndOfStatement()) {
      reportDiagnostic(DiagnosticsId::DI_STMT_SAME_LINE, "for loop body");
    }

    if (_token != SQUIRREL_EOB && _token != _SC('}')) {
      if (line() != body->lineEnd() && column() > c) {
        reportDiagnostic(DiagnosticsId::DI_SUSPICIOUS_FMT);
      }
    }

    return setCoordinates(newNode<ForStatement>(init, cond, mod, body), l, c);
}